

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

void __thiscall kratos::Generator::unwire(Generator *this,Var *var1,Var *var2)

{
  bool bVar1;
  StatementType SVar2;
  __shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  element_type *peVar3;
  Var **ppVVar4;
  undefined1 local_88 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt_1;
  undefined1 local_70 [8];
  shared_ptr<kratos::AssignStmt> assign_stmt;
  shared_ptr<kratos::Stmt> *stmt;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range1;
  shared_ptr<kratos::Stmt> target;
  Var *var2_local;
  Var *var1_local;
  Generator *this_local;
  
  target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var2;
  std::shared_ptr<kratos::Stmt>::shared_ptr((shared_ptr<kratos::Stmt> *)&__range1,(nullptr_t)0x0);
  __end1 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin(&this->stmts_);
  stmt = (shared_ptr<kratos::Stmt> *)
         std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::end(&this->stmts_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                     *)&stmt), bVar1) {
    this_00 = (__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    SVar2 = Stmt::type(this_01);
    if (SVar2 == Assign) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (this_00);
      Stmt::as<kratos::AssignStmt>((Stmt *)local_70);
      peVar3 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_70);
      ppVVar4 = AssignStmt::left(peVar3);
      if (*ppVVar4 == var1) {
        peVar3 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
        ppVVar4 = AssignStmt::right(peVar3);
        if (*ppVVar4 !=
            (Var *)target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi) goto LAB_001ef1e0;
LAB_001ef234:
        std::shared_ptr<kratos::Stmt>::operator=
                  ((shared_ptr<kratos::Stmt> *)&__range1,(shared_ptr<kratos::AssignStmt> *)local_70)
        ;
        assign_stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ = 2;
      }
      else {
LAB_001ef1e0:
        peVar3 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_70);
        ppVVar4 = AssignStmt::right(peVar3);
        if (*ppVVar4 == var1) {
          peVar3 = std::
                   __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_70);
          ppVVar4 = AssignStmt::left(peVar3);
          if (*ppVVar4 ==
              (Var *)target.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi) goto LAB_001ef234;
        }
        assign_stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ = 0;
      }
      std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_70);
      if (assign_stmt_1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ != 0) break;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end1);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range1);
  if (bVar1) {
    std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               &__range1);
    Stmt::as<kratos::AssignStmt>((Stmt *)local_88);
    peVar3 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
    ppVVar4 = AssignStmt::left(peVar3);
    (*((*ppVVar4)->super_IRNode)._vptr_IRNode[0x13])(*ppVVar4,local_88);
    peVar3 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
    ppVVar4 = AssignStmt::right(peVar3);
    (*((*ppVVar4)->super_IRNode)._vptr_IRNode[0xf])(*ppVVar4,local_88);
    remove_stmt(this,(shared_ptr<kratos::Stmt> *)&__range1);
    std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_88);
  }
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&__range1);
  return;
}

Assistant:

void Generator::unwire(Var &var1, Var &var2) {
    // brute force search matching statement
    std::shared_ptr<Stmt> target = nullptr;
    for (auto const &stmt : stmts_) {
        if (stmt->type() == StatementType::Assign) {
            auto assign_stmt = stmt->as<AssignStmt>();
            if ((assign_stmt->left() == &var1 && assign_stmt->right() == &var2) ||
                (assign_stmt->right() == &var1 && assign_stmt->left() == &var2)) {
                target = assign_stmt;
                break;
            }
        }
    }
    if (target) {
        auto assign_stmt = target->as<AssignStmt>();
        assign_stmt->left()->remove_source(assign_stmt);
        assign_stmt->right()->remove_sink(assign_stmt);
        remove_stmt(target);
    }
}